

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

float Assimp::FBX::ParseTokenAsFloat(Token *t,char **err_out)

{
  ulong uVar1;
  char *pcVar2;
  ulong __n;
  ai_real ret;
  char temp [32];
  float local_2c;
  char local_28 [32];
  
  *err_out = (char *)0x0;
  if (t->type == TokenType_DATA) {
    if (t->column != 0xffffffff) {
      __n = (long)t->send - (long)t->sbegin;
      if (__n != 0) {
        memmove(local_28,t->sbegin,__n);
      }
      uVar1 = 0x1f;
      if (__n < 0x1f) {
        uVar1 = __n;
      }
      local_28[uVar1] = '\0';
      local_2c = 0.0;
      fast_atoreal_move<float>(local_28,&local_2c,true);
      return local_2c;
    }
    pcVar2 = t->sbegin;
    if (*pcVar2 == 'D') {
      return (float)*(double *)(pcVar2 + 1);
    }
    if (*pcVar2 == 'F') {
      return *(float *)(pcVar2 + 1);
    }
    pcVar2 = "failed to parse F(loat) or D(ouble), unexpected data type (binary)";
  }
  else {
    pcVar2 = "expected TOK_DATA token";
  }
  *err_out = pcVar2;
  return 0.0;
}

Assistant:

float ParseTokenAsFloat(const Token& t, const char*& err_out)
{
    err_out = NULL;

    if (t.Type() != TokenType_DATA) {
        err_out = "expected TOK_DATA token";
        return 0.0f;
    }

    if(t.IsBinary())
    {
        const char* data = t.begin();
        if (data[0] != 'F' && data[0] != 'D') {
            err_out = "failed to parse F(loat) or D(ouble), unexpected data type (binary)";
            return 0.0f;
        }

        if (data[0] == 'F') {
            return SafeParse<float>(data+1, t.end());
        }
        else {
            return static_cast<float>( SafeParse<double>(data+1, t.end()) );
        }
    }

    // need to copy the input string to a temporary buffer
    // first - next in the fbx token stream comes ',',
    // which fast_atof could interpret as decimal point.
#define MAX_FLOAT_LENGTH 31
    char temp[MAX_FLOAT_LENGTH + 1];
    const size_t length = static_cast<size_t>(t.end()-t.begin());
    std::copy(t.begin(),t.end(),temp);
    temp[std::min(static_cast<size_t>(MAX_FLOAT_LENGTH),length)] = '\0';

    return fast_atof(temp);
}